

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack23_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x7fffff;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x17;
  *puVar1 = (in[1] & 0x3fff) << 9 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0xe;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0x1f) << 0x12 | *puVar1;
  out[3] = *puVar2 >> 5 & 0x7fffff;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 0x1c;
  *puVar1 = (in[3] & 0x7ffff) << 4 | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[3] >> 0x13;
  *puVar1 = (in[4] & 0x3ff) << 0xd | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[4] >> 10;
  puVar2 = in + 5;
  *puVar1 = (*puVar2 & 1) << 0x16 | *puVar1;
  out[7] = *puVar2 >> 1 & 0x7fffff;
  puVar1 = out + 8;
  *puVar1 = *puVar2 >> 0x18;
  *puVar1 = (in[6] & 0x7fff) << 8 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[6] >> 0xf;
  puVar2 = in + 7;
  *puVar1 = (*puVar2 & 0x3f) << 0x11 | *puVar1;
  out[10] = *puVar2 >> 6 & 0x7fffff;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 0x1d;
  *puVar1 = (in[8] & 0xfffff) << 3 | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[8] >> 0x14;
  *puVar1 = (in[9] & 0x7ff) << 0xc | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[9] >> 0xb;
  puVar2 = in + 10;
  *puVar1 = (*puVar2 & 3) << 0x15 | *puVar1;
  out[0xe] = *puVar2 >> 2 & 0x7fffff;
  puVar1 = out + 0xf;
  *puVar1 = *puVar2 >> 0x19;
  *puVar1 = (in[0xb] & 0xffff) << 7 | *puVar1;
  return in + 0xc;
}

Assistant:

const uint32_t *__fastunpack23_16(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 14)) << (23 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 5)) << (23 - 5);
  out++;
  *out = ((*in) >> 5) % (1U << 23);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 19)) << (23 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 10)) << (23 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 1)) << (23 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 23);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 15)) << (23 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 6)) << (23 - 6);
  out++;
  *out = ((*in) >> 6) % (1U << 23);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 20)) << (23 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 11)) << (23 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 2)) << (23 - 2);
  out++;
  *out = ((*in) >> 2) % (1U << 23);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 16)) << (23 - 16);
  out++;

  return in + 1;
}